

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetPresenceIndex
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  ulong uVar2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar3;
  size_type sVar4;
  const_reference ppFVar5;
  LogMessage *pLVar6;
  string *value;
  LogFinisher local_75 [13];
  LogMessage local_68;
  FieldDescriptor *local_30;
  FieldDescriptor *field;
  int i;
  int index;
  FieldDescriptor *descriptor_local;
  MessageGenerator *this_local;
  
  _i = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  bVar1 = RequiresPresenceBit(descriptor);
  if (bVar1) {
    field._4_4_ = 0;
    field._0_4_ = 0;
    while( true ) {
      uVar2 = (ulong)(int)field;
      pvVar3 = fields_by_number(this);
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(pvVar3);
      if (sVar4 <= uVar2) break;
      pvVar3 = fields_by_number(this);
      ppFVar5 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](pvVar3,(long)(int)field);
      local_30 = *ppFVar5;
      if (local_30 == _i) {
        return field._4_4_;
      }
      bVar1 = RequiresPresenceBit(local_30);
      if (bVar1) {
        field._4_4_ = field._4_4_ + 1;
      }
      field._0_4_ = (int)field + 1;
    }
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_message.cc"
               ,0x2ff);
    pLVar6 = internal::LogMessage::operator<<(&local_68,"Could not find presence index for field ");
    value = FieldDescriptor::name_abi_cxx11_(_i);
    pLVar6 = internal::LogMessage::operator<<(pLVar6,value);
    internal::LogFinisher::operator=(local_75,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return -1;
}

Assistant:

int MessageGenerator::GetPresenceIndex(const FieldDescriptor* descriptor) {
  if (!RequiresPresenceBit(descriptor)) {
    return -1;
  }

  int index = 0;
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    if (field == descriptor) {
      return index;
    }
    if (RequiresPresenceBit(field)) {
      index++;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find presence index for field " << descriptor->name();
  return -1;
}